

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qc_utils.c
# Opt level: O3

int qc_nblockque_put(QcNBlockQue *nblckQ,void *ptr)

{
  uint cell;
  int iVar1;
  char *str;
  
  if (nblckQ->with_rwlock != 0) {
    qc_thread_mutex_lock(nblckQ->mutex);
  }
  cell = qc_staticlist_get_head(&nblckQ->lst_free);
  if (cell == 0xffffff9d) {
    iVar1 = -100;
  }
  else {
    if ((int)cell < 0) {
      str = "error happend when get from freelst";
      iVar1 = 0x13e;
    }
    else {
      *(void **)((long)nblckQ->buff + (ulong)cell * 8) = ptr;
      iVar1 = qc_staticlist_add_tail(&nblckQ->lst_used,cell);
      if (-1 < iVar1) goto LAB_00105d0d;
      str = "error happend when add tail to usedlst";
      iVar1 = 0x14a;
    }
    _qc_error("/workspace/llm4binary/github/license_all_cmakelists_1510/zhanglw-dev[P]queue-c/src/qc_rt/qc_utils.c"
              ,iVar1,str);
    iVar1 = -1;
  }
LAB_00105d0d:
  if (nblckQ->with_rwlock != 0) {
    qc_thread_mutex_unlock(nblckQ->mutex);
  }
  return iVar1;
}

Assistant:

int qc_nblockque_put(QcNBlockQue *nblckQ, void *ptr)
{
	int index;
	void **pp_data;

	if (nblckQ->with_rwlock)
		qc_thread_mutex_lock(nblckQ->mutex);

	index = qc_staticlist_get_head(&nblckQ->lst_free);
	if (QC_INVALID_INT == index)
	{
		if (nblckQ->with_rwlock)
			qc_thread_mutex_unlock(nblckQ->mutex);
		return QC_FULLED;
	}
	else if (index < 0)
	{
		qc_error("error happend when get from freelst");
		if (nblckQ->with_rwlock)
			qc_thread_mutex_unlock(nblckQ->mutex);
		return -1;
	}

	pp_data = nblckQ->buff;
	pp_data[index] = ptr;

	index = qc_staticlist_add_tail(&nblckQ->lst_used, index);
	if (index < 0)
	{
		qc_error("error happend when add tail to usedlst");
		if (nblckQ->with_rwlock)
			qc_thread_mutex_unlock(nblckQ->mutex);
		return -1;
	}

	if (nblckQ->with_rwlock)
		qc_thread_mutex_unlock(nblckQ->mutex);

	return index;
}